

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O1

void __thiscall
TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValuesWhileParametersAreIgnored_Test::
testBody(TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValuesWhileParametersAreIgnored_Test
         *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  MockSupport *pMVar4;
  undefined4 extraout_var;
  long *plVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  UtestShell *pUVar6;
  TestTerminator *pTVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  char *pcVar8;
  undefined4 extraout_var_08;
  char *pcVar9;
  SimpleString local_120;
  SimpleString local_110;
  SimpleString local_100;
  SimpleString local_f0;
  MockNamedValue local_e0;
  MockNamedValue local_90;
  SimpleString local_40;
  SimpleString local_30;
  
  SimpleString::SimpleString((SimpleString *)&local_e0,"");
  pMVar4 = mock((SimpleString *)&local_e0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&local_90,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[3])(pMVar4,&local_90);
  SimpleString::SimpleString(&local_120,"p1");
  plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x58))
                             ((long *)CONCAT44(extraout_var,iVar3),&local_120,1);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x48))(plVar5);
  (**(code **)(*plVar5 + 0xc0))(plVar5,1);
  SimpleString::~SimpleString(&local_120);
  SimpleString::~SimpleString((SimpleString *)&local_90);
  SimpleString::~SimpleString((SimpleString *)&local_e0);
  SimpleString::SimpleString((SimpleString *)&local_e0,"");
  pMVar4 = mock((SimpleString *)&local_e0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&local_90,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[3])(pMVar4,&local_90);
  SimpleString::SimpleString(&local_120,"p1");
  plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x58))
                             ((long *)CONCAT44(extraout_var_00,iVar3),&local_120,1);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x48))(plVar5);
  (**(code **)(*plVar5 + 0xc0))(plVar5,0);
  SimpleString::~SimpleString(&local_120);
  SimpleString::~SimpleString((SimpleString *)&local_90);
  SimpleString::~SimpleString((SimpleString *)&local_e0);
  SimpleString::SimpleString((SimpleString *)&local_90,"");
  pMVar4 = mock((SimpleString *)&local_90,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_120,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_120);
  SimpleString::SimpleString(&local_110,"p1");
  plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x40))
                             ((long *)CONCAT44(extraout_var_01,iVar3),&local_110,1);
  (**(code **)(*plVar5 + 0xa8))(&local_e0,plVar5);
  bVar1 = MockNamedValue::getBoolValue(&local_e0);
  MockNamedValue::~MockNamedValue(&local_e0);
  SimpleString::~SimpleString(&local_110);
  SimpleString::~SimpleString(&local_120);
  SimpleString::~SimpleString((SimpleString *)&local_90);
  if (bVar1) {
    pUVar6 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar6->_vptr_UtestShell[0xe])
              (pUVar6,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18a,pTVar7);
  }
  else {
    SimpleString::SimpleString(&local_120,"");
    pMVar4 = mock(&local_120,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_110,"foo");
    iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_110);
    SimpleString::SimpleString(&local_f0,"p1");
    plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x40))
                               ((long *)CONCAT44(extraout_var_02,iVar3),&local_f0,1);
    (**(code **)(*plVar5 + 0xa8))(&local_e0,plVar5);
    bVar1 = MockNamedValue::getBoolValue(&local_e0);
    SimpleString::SimpleString(&local_100,"");
    pMVar4 = mock(&local_100,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_30,"foo");
    iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_30);
    SimpleString::SimpleString(&local_40,"p1");
    plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x40))
                               ((long *)CONCAT44(extraout_var_03,iVar3),&local_40,1);
    (**(code **)(*plVar5 + 0xa8))(&local_90,plVar5);
    bVar2 = MockNamedValue::getBoolValue(&local_90);
    MockNamedValue::~MockNamedValue(&local_90);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_30);
    SimpleString::~SimpleString(&local_100);
    MockNamedValue::~MockNamedValue(&local_e0);
    SimpleString::~SimpleString(&local_f0);
    SimpleString::~SimpleString(&local_110);
    SimpleString::~SimpleString(&local_120);
    if (bVar1 != bVar2) {
      pUVar6 = UtestShell::getCurrent();
      (*pUVar6->_vptr_UtestShell[0x1c])
                (pUVar6,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                 ,0x18a);
    }
    pUVar6 = UtestShell::getCurrent();
    ::StringFrom(SUB81(&local_90,0));
    pcVar8 = SimpleString::asCharString((SimpleString *)&local_90);
    SimpleString::SimpleString(&local_110,"");
    pMVar4 = mock(&local_110,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_f0,"foo");
    iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_f0);
    SimpleString::SimpleString(&local_100,"p1");
    plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x40))
                               ((long *)CONCAT44(extraout_var_04,iVar3),&local_100,1);
    (**(code **)(*plVar5 + 0xa8))(&local_e0,plVar5);
    MockNamedValue::getBoolValue(&local_e0);
    ::StringFrom(SUB81(&local_120,0));
    pcVar9 = SimpleString::asCharString(&local_120);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar6->_vptr_UtestShell[0x16])
              (pUVar6,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18a,pTVar7);
    SimpleString::~SimpleString(&local_120);
    MockNamedValue::~MockNamedValue(&local_e0);
    SimpleString::~SimpleString(&local_100);
    SimpleString::~SimpleString(&local_f0);
    SimpleString::~SimpleString(&local_110);
    SimpleString::~SimpleString((SimpleString *)&local_90);
  }
  SimpleString::SimpleString((SimpleString *)&local_90,"");
  pMVar4 = mock((SimpleString *)&local_90,(MockFailureReporter *)0x0);
  (*pMVar4->_vptr_MockSupport[8])(&local_e0,pMVar4);
  bVar1 = MockNamedValue::getBoolValue(&local_e0);
  MockNamedValue::~MockNamedValue(&local_e0);
  SimpleString::~SimpleString((SimpleString *)&local_90);
  if (bVar1) {
    pUVar6 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar6->_vptr_UtestShell[0xe])
              (pUVar6,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18b,pTVar7);
  }
  else {
    SimpleString::SimpleString(&local_120,"");
    pMVar4 = mock(&local_120,(MockFailureReporter *)0x0);
    (*pMVar4->_vptr_MockSupport[8])(&local_e0,pMVar4);
    bVar1 = MockNamedValue::getBoolValue(&local_e0);
    SimpleString::SimpleString(&local_110,"");
    pMVar4 = mock(&local_110,(MockFailureReporter *)0x0);
    (*pMVar4->_vptr_MockSupport[8])(&local_90,pMVar4);
    bVar2 = MockNamedValue::getBoolValue(&local_90);
    MockNamedValue::~MockNamedValue(&local_90);
    SimpleString::~SimpleString(&local_110);
    MockNamedValue::~MockNamedValue(&local_e0);
    SimpleString::~SimpleString(&local_120);
    if (bVar1 != bVar2) {
      pUVar6 = UtestShell::getCurrent();
      (*pUVar6->_vptr_UtestShell[0x1c])
                (pUVar6,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                 ,0x18b);
    }
    pUVar6 = UtestShell::getCurrent();
    ::StringFrom(SUB81(&local_90,0));
    pcVar8 = SimpleString::asCharString((SimpleString *)&local_90);
    SimpleString::SimpleString(&local_110,"");
    pMVar4 = mock(&local_110,(MockFailureReporter *)0x0);
    (*pMVar4->_vptr_MockSupport[8])(&local_e0,pMVar4);
    MockNamedValue::getBoolValue(&local_e0);
    ::StringFrom(SUB81(&local_120,0));
    pcVar9 = SimpleString::asCharString(&local_120);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar6->_vptr_UtestShell[0x16])
              (pUVar6,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18b,pTVar7);
    SimpleString::~SimpleString(&local_120);
    MockNamedValue::~MockNamedValue(&local_e0);
    SimpleString::~SimpleString(&local_110);
    SimpleString::~SimpleString((SimpleString *)&local_90);
  }
  SimpleString::SimpleString((SimpleString *)&local_90,"");
  pMVar4 = mock((SimpleString *)&local_90,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_120,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_120);
  SimpleString::SimpleString(&local_110,"p1");
  plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x40))
                             ((long *)CONCAT44(extraout_var_05,iVar3),&local_110,1);
  (**(code **)(*plVar5 + 0xa8))(&local_e0,plVar5);
  bVar1 = MockNamedValue::getBoolValue(&local_e0);
  MockNamedValue::~MockNamedValue(&local_e0);
  SimpleString::~SimpleString(&local_110);
  SimpleString::~SimpleString(&local_120);
  SimpleString::~SimpleString((SimpleString *)&local_90);
  if (bVar1) {
    SimpleString::SimpleString(&local_120,"");
    pMVar4 = mock(&local_120,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_110,"foo");
    iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_110);
    SimpleString::SimpleString(&local_f0,"p1");
    plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0x40))
                               ((long *)CONCAT44(extraout_var_06,iVar3),&local_f0,1);
    (**(code **)(*plVar5 + 0xa8))(&local_e0,plVar5);
    bVar1 = MockNamedValue::getBoolValue(&local_e0);
    SimpleString::SimpleString(&local_100,"");
    pMVar4 = mock(&local_100,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_30,"foo");
    iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_30);
    SimpleString::SimpleString(&local_40,"p1");
    plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0x40))
                               ((long *)CONCAT44(extraout_var_07,iVar3),&local_40,1);
    (**(code **)(*plVar5 + 0xa8))(&local_90,plVar5);
    bVar2 = MockNamedValue::getBoolValue(&local_90);
    MockNamedValue::~MockNamedValue(&local_90);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_30);
    SimpleString::~SimpleString(&local_100);
    MockNamedValue::~MockNamedValue(&local_e0);
    SimpleString::~SimpleString(&local_f0);
    SimpleString::~SimpleString(&local_110);
    SimpleString::~SimpleString(&local_120);
    if (bVar1 != bVar2) {
      pUVar6 = UtestShell::getCurrent();
      (*pUVar6->_vptr_UtestShell[0x1c])
                (pUVar6,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                 ,0x18c);
    }
    pUVar6 = UtestShell::getCurrent();
    ::StringFrom(SUB81(&local_90,0));
    pcVar8 = SimpleString::asCharString((SimpleString *)&local_90);
    SimpleString::SimpleString(&local_110,"");
    pMVar4 = mock(&local_110,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_f0,"foo");
    iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_f0);
    SimpleString::SimpleString(&local_100,"p1");
    plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_08,iVar3) + 0x40))
                               ((long *)CONCAT44(extraout_var_08,iVar3),&local_100,1);
    (**(code **)(*plVar5 + 0xa8))(&local_e0,plVar5);
    MockNamedValue::getBoolValue(&local_e0);
    ::StringFrom(SUB81(&local_120,0));
    pcVar9 = SimpleString::asCharString(&local_120);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar6->_vptr_UtestShell[0x16])
              (pUVar6,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18c,pTVar7);
    SimpleString::~SimpleString(&local_120);
    MockNamedValue::~MockNamedValue(&local_e0);
    SimpleString::~SimpleString(&local_100);
    SimpleString::~SimpleString(&local_f0);
    SimpleString::~SimpleString(&local_110);
    SimpleString::~SimpleString((SimpleString *)&local_90);
  }
  else {
    pUVar6 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar6->_vptr_UtestShell[0xe])
              (pUVar6,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18c,pTVar7);
  }
  SimpleString::SimpleString((SimpleString *)&local_90,"");
  pMVar4 = mock((SimpleString *)&local_90,(MockFailureReporter *)0x0);
  (*pMVar4->_vptr_MockSupport[8])(&local_e0,pMVar4);
  bVar1 = MockNamedValue::getBoolValue(&local_e0);
  MockNamedValue::~MockNamedValue(&local_e0);
  SimpleString::~SimpleString((SimpleString *)&local_90);
  if (bVar1) {
    SimpleString::SimpleString(&local_120,"");
    pMVar4 = mock(&local_120,(MockFailureReporter *)0x0);
    (*pMVar4->_vptr_MockSupport[8])(&local_e0,pMVar4);
    bVar1 = MockNamedValue::getBoolValue(&local_e0);
    SimpleString::SimpleString(&local_110,"");
    pMVar4 = mock(&local_110,(MockFailureReporter *)0x0);
    (*pMVar4->_vptr_MockSupport[8])(&local_90,pMVar4);
    bVar2 = MockNamedValue::getBoolValue(&local_90);
    MockNamedValue::~MockNamedValue(&local_90);
    SimpleString::~SimpleString(&local_110);
    MockNamedValue::~MockNamedValue(&local_e0);
    SimpleString::~SimpleString(&local_120);
    if (bVar1 != bVar2) {
      pUVar6 = UtestShell::getCurrent();
      (*pUVar6->_vptr_UtestShell[0x1c])
                (pUVar6,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                 ,0x18d);
    }
    pUVar6 = UtestShell::getCurrent();
    ::StringFrom(SUB81(&local_90,0));
    pcVar8 = SimpleString::asCharString((SimpleString *)&local_90);
    SimpleString::SimpleString(&local_110,"");
    pMVar4 = mock(&local_110,(MockFailureReporter *)0x0);
    (*pMVar4->_vptr_MockSupport[8])(&local_e0,pMVar4);
    MockNamedValue::getBoolValue(&local_e0);
    ::StringFrom(SUB81(&local_120,0));
    pcVar9 = SimpleString::asCharString(&local_120);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar6->_vptr_UtestShell[0x16])
              (pUVar6,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18d,pTVar7);
    SimpleString::~SimpleString(&local_120);
    MockNamedValue::~MockNamedValue(&local_e0);
    SimpleString::~SimpleString(&local_110);
    SimpleString::~SimpleString((SimpleString *)&local_90);
  }
  else {
    pUVar6 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar6->_vptr_UtestShell[0xe])
              (pUVar6,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18d,pTVar7);
  }
  return;
}

Assistant:

TEST(MockReturnValueTest, BooleanReturnValueSetsDifferentValuesWhileParametersAreIgnored)
{
    bool ret_value = true;
    bool another_ret_value = false;

    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(ret_value);
    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(another_ret_value);

    CHECK_EQUAL(ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getBoolValue());
    CHECK_EQUAL(ret_value, mock().returnValue().getBoolValue());
    CHECK_EQUAL(another_ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getBoolValue());
    CHECK_EQUAL(another_ret_value, mock().returnValue().getBoolValue());
}